

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

int utf8casecmp(void *src1,void *src2)

{
  bool bVar1;
  uchar b;
  uchar a;
  uchar *s2;
  uchar *s1;
  void *src2_local;
  void *src1_local;
  
  s2 = (uchar *)src2;
  s1 = (uchar *)src1;
  while( true ) {
    bVar1 = true;
    if (*s1 == '\0') {
      bVar1 = *s2 != '\0';
    }
    if (!bVar1) {
      return 0;
    }
    a = *s1;
    b = *s2;
    if ((0x40 < a) && (a < 0x5b)) {
      a = a | 0x20;
    }
    if ((0x40 < b) && (b < 0x5b)) {
      b = b | 0x20;
    }
    if (a < b) break;
    if (b < a) {
      return 1;
    }
    s1 = s1 + 1;
    s2 = s2 + 1;
  }
  return -1;
}

Assistant:

int utf8casecmp(const void *src1, const void *src2) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while (('\0' != *s1) || ('\0' != *s2)) {
    unsigned char a = *s1;
    unsigned char b = *s2;

    if (('A' <= a) && ('Z' >= a)) {
      a |= 0x20; // make a lowercase
    }

    if (('A' <= b) && ('Z' >= b)) {
      b |= 0x20; // make b lowercase
    }

    if (a < b) {
      return -1;
    } else if (a > b) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}